

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Interpreter interpreter;
  ptr<Object> module;
  ptr<ObjectExpression> moduleExpression;
  Parser parser;
  Interpreter local_a8;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  undefined1 local_88 [120];
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Usage: katon <filepath>",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
  }
  else {
    Parser::Parser((Parser *)(local_88 + 0x10),argv[1]);
    Parser::parse((Parser *)local_88);
    (*(code *)**(undefined8 **)local_88._0_8_)(&local_a8,local_88._0_8_,0);
    (*((local_a8.object.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Value)
      .super_Member._vptr_Member[6])(&local_98);
    if (local_a8.object.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.object.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_90->_M_use_count = local_90->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_90->_M_use_count = local_90->_M_use_count + 1;
      }
    }
    local_a8.object.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_98;
    local_a8.object.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_90;
    if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_90->_M_use_count = local_90->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_90->_M_use_count = local_90->_M_use_count + 1;
      }
      if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
      }
    }
    Interpreter::execute(&local_a8,false);
    if (local_a8.object.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.object.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    }
    Parser::~Parser((Parser *)(local_88 + 0x10));
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    if(argc < 2) {
        std::cout << "Usage: katon <filepath>" << std::endl;
        return 0;
    }

    char* filename = argv[1];

    try {
        Parser parser(filename);
        ptr<ObjectExpression> moduleExpression = parser.parse();
        ptr<Object> module = moduleExpression -> evaluate(nullptr) -> asObject();

        Interpreter interpreter(module);
        interpreter.execute();

    } catch(ParseException& e) {
        std::cout << e.what() << std::endl;
    } catch(ThrowPacket& packet) {
        std::cout << "Error: " << packet.getValue() -> asString() << std::endl;
    }

    return 0;
}